

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeDouble(ParserImpl *this,double *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TokenType TVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  double dVar7;
  string_view message;
  string_view message_00;
  string text;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  AlphaNum local_60;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"-","");
  bVar4 = TryConsume(this,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  TVar2 = (this->tokenizer_).current_.type;
  if (TVar2 == TYPE_IDENTIFIER) {
    paVar1 = &local_d0.field_2;
    pcVar3 = (this->tokenizer_).current_.text._M_dataplus._M_p;
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar3,pcVar3 + (this->tokenizer_).current_.text._M_string_length
              );
    absl::lts_20250127::AsciiStrToLower(&local_d0);
    iVar6 = std::__cxx11::string::compare((char *)&local_d0);
    dVar7 = INFINITY;
    if (iVar6 != 0) {
      iVar6 = std::__cxx11::string::compare((char *)&local_d0);
      dVar7 = INFINITY;
      if (iVar6 != 0) {
        iVar6 = std::__cxx11::string::compare((char *)&local_d0);
        if (iVar6 != 0) {
          local_90._M_dataplus._M_p = &DAT_00000016;
          local_90._M_string_length = 0x144222c;
          local_60.piece_._M_len = local_d0._M_string_length;
          local_60.piece_._M_str = local_d0._M_dataplus._M_p;
          absl::lts_20250127::StrCat_abi_cxx11_
                    (&local_b0,(lts_20250127 *)&local_90,&local_60,
                     (AlphaNum *)local_d0._M_string_length);
          message._M_str = local_b0._M_dataplus._M_p;
          message._M_len = local_b0._M_string_length;
          ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      message);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p == paVar1) {
            return false;
          }
          goto LAB_00ffd689;
        }
        dVar7 = NAN;
      }
    }
    *value = dVar7;
    io::Tokenizer::Next(&this->tokenizer_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (TVar2 == TYPE_INTEGER) {
      bVar5 = ConsumeUnsignedDecimalAsDouble(this,value,0xffffffffffffffff);
      if (!bVar4 || !bVar5) {
        return bVar5;
      }
      goto LAB_00ffd6cc;
    }
    if (TVar2 != TYPE_FLOAT) {
      local_90._M_dataplus._M_p = &DAT_00000016;
      local_90._M_string_length = 0x144222c;
      local_60.piece_._M_str = (this->tokenizer_).current_.text._M_dataplus._M_p;
      local_60.piece_._M_len = (this->tokenizer_).current_.text._M_string_length;
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_d0,(lts_20250127 *)&local_90,&local_60,(AlphaNum *)local_60.piece_._M_len);
      message_00._M_str = local_d0._M_dataplus._M_p;
      message_00._M_len = local_d0._M_string_length;
      ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                  message_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p == &local_d0.field_2) {
        return false;
      }
LAB_00ffd689:
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      return false;
    }
    dVar7 = io::Tokenizer::ParseFloat(&(this->tokenizer_).current_.text);
    *value = dVar7;
    io::Tokenizer::Next(&this->tokenizer_);
  }
  if (!bVar4) {
    return true;
  }
LAB_00ffd6cc:
  *value = -*value;
  return true;
}

Assistant:

bool ConsumeDouble(double* value) {
    bool negative = false;

    if (TryConsume("-")) {
      negative = true;
    }

    // A double can actually be an integer, according to the tokenizer.
    // Therefore, we must check both cases here.
    if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
      // We have found an integer value for the double.
      DO(ConsumeUnsignedDecimalAsDouble(value, kuint64max));
    } else if (LookingAtType(io::Tokenizer::TYPE_FLOAT)) {
      // We have found a float value for the double.
      *value = io::Tokenizer::ParseFloat(tokenizer_.current().text);

      // Mark the current token as consumed.
      tokenizer_.Next();
    } else if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      std::string text = tokenizer_.current().text;
      absl::AsciiStrToLower(&text);
      if (text == "inf" ||
          text == "infinity") {
        *value = std::numeric_limits<double>::infinity();
        tokenizer_.Next();
      } else if (text == "nan") {
        *value = std::numeric_limits<double>::quiet_NaN();
        tokenizer_.Next();
      } else {
        ReportError(absl::StrCat("Expected double, got: ", text));
        return false;
      }
    } else {
      ReportError(
          absl::StrCat("Expected double, got: ", tokenizer_.current().text));
      return false;
    }

    if (negative) {
      *value = -*value;
    }

    return true;
  }